

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O1

void __thiscall BufferInputSource::seek(BufferInputSource *this,qpdf_offset_t offset,int whence)

{
  qpdf_offset_t *cur;
  runtime_error *this_00;
  logic_error *this_01;
  qpdf_offset_t local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_40 = offset;
  if (whence == 2) {
    if (0 < offset != this->max_offset < 1) {
      QIntC::range_check_error<long_long>(&this->max_offset,&local_40);
    }
    this->cur_offset = local_40 + this->max_offset;
  }
  else if (whence == 1) {
    cur = &this->cur_offset;
    if (0 < offset != this->cur_offset < 1) {
      QIntC::range_check_error<long_long>(cur,&local_40);
    }
    *cur = *cur + local_40;
  }
  else {
    if (whence != 0) {
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_01,"INTERNAL ERROR: invalid argument to BufferInputSource::seek");
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this->cur_offset = offset;
  }
  if (-1 < this->cur_offset) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,&this->description,": seek before beginning of buffer");
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
BufferInputSource::seek(qpdf_offset_t offset, int whence)
{
    switch (whence) {
    case SEEK_SET:
        this->cur_offset = offset;
        break;

    case SEEK_END:
        QIntC::range_check(this->max_offset, offset);
        this->cur_offset = this->max_offset + offset;
        break;

    case SEEK_CUR:
        QIntC::range_check(this->cur_offset, offset);
        this->cur_offset += offset;
        break;

    default:
        throw std::logic_error("INTERNAL ERROR: invalid argument to BufferInputSource::seek");
        break;
    }

    if (this->cur_offset < 0) {
        throw std::runtime_error(this->description + ": seek before beginning of buffer");
    }
}